

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  long lVar2;
  ushort uVar3;
  bool bVar4;
  ushort uVar5;
  uint32_t uVar6;
  uint uVar7;
  CommonFields *common;
  PolicyFunctions *in_R9;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i match;
  char cVar11;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar12 [16];
  iterator iVar28;
  string_view v;
  FindInfo target;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_88;
  CommonFields *local_70;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  v._M_str = (key->_M_dataplus)._M_p;
  v._M_len = key->_M_string_length;
  common = (CommonFields *)StringHash::operator()((StringHash *)this,v);
  probe(&local_88,(CommonFields *)this,(size_t)common);
  lVar2 = *(long *)(this + 0x10);
  auVar9 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
  auVar9 = pshuflw(auVar9,auVar9,0);
  uVar8 = auVar9._0_4_;
  auVar9._4_4_ = uVar8;
  auVar9._0_4_ = uVar8;
  auVar9._8_4_ = uVar8;
  auVar9._12_4_ = uVar8;
  do {
    pcVar1 = (char *)(lVar2 + local_88.offset_);
    auVar10[0] = -(auVar9[0] == *pcVar1);
    auVar10[1] = -(auVar9[1] == pcVar1[1]);
    auVar10[2] = -(auVar9[2] == pcVar1[2]);
    auVar10[3] = -(auVar9[3] == pcVar1[3]);
    auVar10[4] = -(auVar9[4] == pcVar1[4]);
    auVar10[5] = -(auVar9[5] == pcVar1[5]);
    auVar10[6] = -(auVar9[6] == pcVar1[6]);
    auVar10[7] = -(auVar9[7] == pcVar1[7]);
    auVar10[8] = -(auVar9[8] == pcVar1[8]);
    auVar10[9] = -(auVar9[9] == pcVar1[9]);
    auVar10[10] = -(auVar9[10] == pcVar1[10]);
    auVar10[0xb] = -(auVar9[0xb] == pcVar1[0xb]);
    auVar10[0xc] = -(auVar9[0xc] == pcVar1[0xc]);
    auVar10[0xd] = -(auVar9[0xd] == pcVar1[0xd]);
    auVar10[0xe] = -(auVar9[0xe] == pcVar1[0xe]);
    auVar10[0xf] = -(auVar9[0xf] == pcVar1[0xf]);
    cVar11 = *pcVar1;
    cVar13 = pcVar1[1];
    cVar14 = pcVar1[2];
    cVar15 = pcVar1[3];
    cVar16 = pcVar1[4];
    cVar17 = pcVar1[5];
    cVar18 = pcVar1[6];
    cVar19 = pcVar1[7];
    cVar20 = pcVar1[8];
    cVar21 = pcVar1[9];
    cVar22 = pcVar1[10];
    cVar23 = pcVar1[0xb];
    cVar24 = pcVar1[0xc];
    cVar25 = pcVar1[0xd];
    cVar26 = pcVar1[0xe];
    cVar27 = pcVar1[0xf];
    for (uVar5 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
        ; uVar5 != 0; uVar5 = uVar5 - 1 & uVar5) {
      local_70 = common;
      local_58 = cVar11;
      cStack_57 = cVar13;
      cStack_56 = cVar14;
      cStack_55 = cVar15;
      cStack_54 = cVar16;
      cStack_53 = cVar17;
      cStack_52 = cVar18;
      cStack_51 = cVar19;
      cStack_50 = cVar20;
      cStack_4f = cVar21;
      cStack_4e = cVar22;
      cStack_4d = cVar23;
      cStack_4c = cVar24;
      cStack_4b = cVar25;
      cStack_4a = cVar26;
      cStack_49 = cVar27;
      local_48 = auVar9;
      uVar6 = TrailingZeros<unsigned_short>(uVar5);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar4 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::AnnotationRecord>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::AnnotationRecord>&>
                        (&local_68,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>
                          *)((local_88.offset_ + uVar6 & local_88.mask_) * 0x60 +
                            *(long *)(this + 0x18)));
      if (bVar4) {
        local_88.mask_ = uVar6 + local_88.offset_ & local_88.mask_;
        bVar4 = false;
        goto LAB_008d9065;
      }
      common = local_70;
      auVar9 = local_48;
      cVar11 = local_58;
      cVar13 = cStack_57;
      cVar14 = cStack_56;
      cVar15 = cStack_55;
      cVar16 = cStack_54;
      cVar17 = cStack_53;
      cVar18 = cStack_52;
      cVar19 = cStack_51;
      cVar20 = cStack_50;
      cVar21 = cStack_4f;
      cVar22 = cStack_4e;
      cVar23 = cStack_4d;
      cVar24 = cStack_4c;
      cVar25 = cStack_4b;
      cVar26 = cStack_4a;
      cVar27 = cStack_49;
    }
    auVar12[0] = -(cVar11 == -0x80);
    auVar12[1] = -(cVar13 == -0x80);
    auVar12[2] = -(cVar14 == -0x80);
    auVar12[3] = -(cVar15 == -0x80);
    auVar12[4] = -(cVar16 == -0x80);
    auVar12[5] = -(cVar17 == -0x80);
    auVar12[6] = -(cVar18 == -0x80);
    auVar12[7] = -(cVar19 == -0x80);
    auVar12[8] = -(cVar20 == -0x80);
    auVar12[9] = -(cVar21 == -0x80);
    auVar12[10] = -(cVar22 == -0x80);
    auVar12[0xb] = -(cVar23 == -0x80);
    auVar12[0xc] = -(cVar24 == -0x80);
    auVar12[0xd] = -(cVar25 == -0x80);
    auVar12[0xe] = -(cVar26 == -0x80);
    auVar12[0xf] = -(cVar27 == -0x80);
    uVar5 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf;
    if (uVar5 != 0) {
      bVar4 = ShouldInsertBackwardsForDebug
                        (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar4) {
        uVar3 = 0xf;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar7 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar7 = TrailingZeros<unsigned_short>(uVar5);
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_88.index_;
      local_88.mask_ =
           PrepareInsertNonSoo((container_internal *)this,common,
                               uVar7 + local_88.offset_ & local_88.mask_,target,in_R9);
      bVar4 = true;
LAB_008d9065:
      iVar28 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::AnnotationRecord>_>_>
                              *)this,local_88.mask_);
      __return_storage_ptr__->first = iVar28;
      __return_storage_ptr__->second = bVar4;
      return __return_storage_ptr__;
    }
    local_88.index_ = local_88.index_ + 0x10;
    local_88.offset_ = local_88.offset_ + local_88.index_ & local_88.mask_;
    if (*(ulong *)this < local_88.index_) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::io::Printer::AnnotationRecord>>, K = std::basic_string<char>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }